

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O1

TestStatus * __thiscall
vkt::shaderexecutor::
BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<tcu::Vector<float,_4>,_tcu::Vector<int,_4>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<tcu::Vector<float,_4>,_vkt::shaderexecutor::Void>_>
::iterate(TestStatus *__return_storage_ptr__,
         BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<tcu::Vector<float,_4>,_tcu::Vector<int,_4>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<tcu::Vector<float,_4>,_vkt::shaderexecutor::Void>_>
         *this)

{
  double *pdVar1;
  _Base_ptr p_Var2;
  _Rb_tree_node_base *p_Var3;
  ostringstream *poVar4;
  ostream *poVar5;
  Precision PVar6;
  Samplings<vkt::shaderexecutor::InTypes<tcu::Vector<float,_4>,_tcu::Vector<int,_4>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  *this_00;
  size_t sVar7;
  Statement *pSVar8;
  ShaderExecutor *pSVar9;
  Variable<tcu::Vector<float,_4>_> *pVVar10;
  pointer pcVar11;
  Variable<tcu::Vector<int,_4>_> *pVVar12;
  undefined7 uVar13;
  TestStatus *pTVar14;
  pointer pVVar15;
  bool bVar16;
  int iVar17;
  undefined8 uVar18;
  long lVar19;
  long lVar20;
  IVal *pIVar21;
  IVal *pIVar22;
  IVal *pIVar23;
  undefined8 *puVar24;
  uint uVar25;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar26;
  FloatFormat *pFVar27;
  string *psVar28;
  char *pcVar29;
  _Base_ptr p_Var30;
  ulong size;
  byte bVar31;
  IVal in2;
  IVal reference1;
  FuncSet funcs;
  IVal in3;
  IVal in0;
  Outputs<vkt::shaderexecutor::OutTypes<tcu::Vector<float,_4>,_vkt::shaderexecutor::Void>_> outputs;
  FloatFormat highpFmt;
  void *outputArr [2];
  Environment env;
  Inputs<vkt::shaderexecutor::InTypes<tcu::Vector<float,_4>,_tcu::Vector<int,_4>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  inputs;
  void *inputArr [4];
  ostringstream oss;
  ResultCollector status;
  deUint32 in_stack_fffffffffffffa78;
  string local_578;
  IVal local_551;
  pointer local_550;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_548;
  undefined1 local_540 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_530;
  _Rb_tree_node_base *local_520;
  double local_518;
  ulong local_4e0;
  FloatFormat *local_4d8;
  string local_4d0;
  TestStatus *local_4b0;
  long local_4a8;
  long local_4a0;
  undefined1 local_498 [32];
  double local_478;
  Precision local_470;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  *local_468;
  undefined4 local_460;
  ios_base local_428 [8];
  ios_base local_420 [264];
  Outputs<vkt::shaderexecutor::OutTypes<tcu::Vector<float,_4>,_vkt::shaderexecutor::Void>_>
  local_318;
  FloatFormat local_2e8;
  pointer local_2b8;
  pointer local_2b0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  local_2a8;
  Inputs<vkt::shaderexecutor::InTypes<tcu::Vector<float,_4>,_tcu::Vector<int,_4>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  local_278;
  pointer local_218;
  pointer local_210;
  pointer local_208;
  pointer local_200;
  IVal local_1f8;
  ios_base local_188 [264];
  ResultCollector local_80;
  
  bVar31 = 0;
  this_00 = this->m_samplings;
  pFVar27 = &(this->m_caseCtx).floatFormat;
  PVar6 = (this->m_caseCtx).precision;
  sVar7 = (this->m_caseCtx).numRandoms;
  local_4b0 = __return_storage_ptr__;
  iVar17 = tcu::CommandLine::getBaseSeed(((this->m_caseCtx).testContext)->m_cmdLine);
  generateInputs<vkt::shaderexecutor::InTypes<tcu::Vector<float,4>,tcu::Vector<int,4>,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void>>
            (&local_278,(shaderexecutor *)this_00,
             (Samplings<vkt::shaderexecutor::InTypes<tcu::Vector<float,_4>,_tcu::Vector<int,_4>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
              *)pFVar27,(FloatFormat *)(ulong)PVar6,(Precision)sVar7,(ulong)(iVar17 + 0xdeadbeef),
             in_stack_fffffffffffffa78);
  pVVar15 = local_278.in0.
            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
            _M_impl.super__Vector_impl_data._M_start;
  size = (long)local_278.in0.
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_finish -
         (long)local_278.in0.
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start >> 4;
  Outputs<vkt::shaderexecutor::OutTypes<tcu::Vector<float,_4>,_vkt::shaderexecutor::Void>_>::Outputs
            (&local_318,size);
  local_2e8.m_maxValue = (this->m_caseCtx).highpFormat.m_maxValue;
  local_2e8.m_minExp = (this->m_caseCtx).highpFormat.m_minExp;
  local_2e8.m_maxExp = (this->m_caseCtx).highpFormat.m_maxExp;
  local_2e8.m_fractionBits = (this->m_caseCtx).highpFormat.m_fractionBits;
  local_2e8.m_hasSubnormal = (this->m_caseCtx).highpFormat.m_hasSubnormal;
  local_2e8.m_hasInf = (this->m_caseCtx).highpFormat.m_hasInf;
  local_2e8.m_hasNaN = (this->m_caseCtx).highpFormat.m_hasNaN;
  local_2e8.m_exactPrecision = (this->m_caseCtx).highpFormat.m_exactPrecision;
  local_2e8._25_7_ = *(undefined7 *)&(this->m_caseCtx).highpFormat.field_0x19;
  local_2a8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_2a8._M_impl.super__Rb_tree_header._M_header;
  local_2a8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_2a8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_2a8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_2a8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_2a8._M_impl.super__Rb_tree_header._M_header._M_left;
  tcu::ResultCollector::ResultCollector(&local_80);
  local_548 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)((this->super_TestInstance).m_context)->m_testCtx->m_log;
  local_218 = local_278.in0.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_start;
  local_210 = local_278.in1.
              super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>._M_impl
              .super__Vector_impl_data._M_start;
  local_208 = local_278.in2.
              super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_200 = local_278.in3.
              super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_2b8 = local_318.out0.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_start;
  local_2b0 = local_318.out1.
              super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
              ._M_impl.super__Vector_impl_data._M_start;
  poVar4 = (ostringstream *)(local_498 + 8);
  local_498._0_8_ = local_548;
  std::__cxx11::ostringstream::ostringstream(poVar4);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4,"Statement: ",0xb);
  std::ostream::_M_insert<bool>(SUB81(poVar4,0));
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_498,(EndMessageToken *)&tcu::TestLog::EndMessage);
  local_550 = pVVar15;
  std::__cxx11::ostringstream::~ostringstream(poVar4);
  std::ios_base::~ios_base(local_420);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1f8);
  p_Var3 = (_Rb_tree_node_base *)(local_540 + 8);
  local_540._8_4_ = _S_red;
  local_530._M_allocated_capacity = 0;
  local_518 = 0.0;
  pSVar8 = (this->m_stmt).super_SharedPtr<const_vkt::shaderexecutor::Statement>.m_ptr;
  local_530._8_8_ = p_Var3;
  local_520 = p_Var3;
  local_4d8 = pFVar27;
  (*pSVar8->_vptr_Statement[4])(pSVar8,local_540);
  if ((_Rb_tree_node_base *)local_530._8_8_ != p_Var3) {
    uVar18 = local_530._8_8_;
    do {
      (**(code **)(**(long **)(uVar18 + 0x20) + 0x30))(*(long **)(uVar18 + 0x20),&local_1f8);
      uVar18 = std::_Rb_tree_increment((_Rb_tree_node_base *)uVar18);
    } while ((_Rb_tree_node_base *)uVar18 != p_Var3);
  }
  pFVar27 = local_4d8;
  if (local_518 != 0.0) {
    poVar4 = (ostringstream *)(local_498 + 8);
    local_498._0_8_ = local_548;
    std::__cxx11::ostringstream::ostringstream(poVar4);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar4,"Reference definitions:\n",0x17);
    std::__cxx11::stringbuf::str();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar4,local_578._M_dataplus._M_p,local_578._M_string_length);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_498,(EndMessageToken *)&tcu::TestLog::EndMessage);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_578._M_dataplus._M_p != &local_578.field_2) {
      operator_delete(local_578._M_dataplus._M_p,local_578.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream(poVar4);
    std::ios_base::~ios_base(local_420);
  }
  std::
  _Rb_tree<const_vkt::shaderexecutor::FuncBase_*,_const_vkt::shaderexecutor::FuncBase_*,_std::_Identity<const_vkt::shaderexecutor::FuncBase_*>,_std::less<const_vkt::shaderexecutor::FuncBase_*>,_std::allocator<const_vkt::shaderexecutor::FuncBase_*>_>
  ::~_Rb_tree((_Rb_tree<const_vkt::shaderexecutor::FuncBase_*,_const_vkt::shaderexecutor::FuncBase_*,_std::_Identity<const_vkt::shaderexecutor::FuncBase_*>,_std::less<const_vkt::shaderexecutor::FuncBase_*>,_std::allocator<const_vkt::shaderexecutor::FuncBase_*>_>
               *)local_540);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1f8);
  std::ios_base::~ios_base(local_188);
  pSVar9 = (this->m_executor).
           super_UniqueBase<vkt::shaderexecutor::ShaderExecutor,_de::DefaultDeleter<vkt::shaderexecutor::ShaderExecutor>_>
           .m_data.ptr;
  local_4e0 = size;
  (*pSVar9->_vptr_ShaderExecutor[2])(pSVar9,size & 0xffffffff,&local_218,&local_2b8,0);
  lVar19 = 0x10;
  do {
    *(undefined1 *)((long)&local_4a8 + lVar19) = 0;
    *(undefined8 *)((long)&local_4a0 + lVar19) = 0x7ff0000000000000;
    *(undefined8 *)(local_498 + lVar19) = 0xfff0000000000000;
    lVar19 = lVar19 + 0x18;
  } while (lVar19 != 0x70);
  lVar19 = 0x10;
  do {
    *(undefined1 *)((long)&local_4a8 + lVar19) = 0;
    *(undefined8 *)((long)&local_4a0 + lVar19) = 0x7ff0000000000000;
    *(undefined8 *)(local_498 + lVar19) = 0xfff0000000000000;
    lVar19 = lVar19 + 0x18;
  } while (lVar19 != 0x70);
  lVar19 = 0x10;
  do {
    *(undefined1 *)((long)&local_208 + lVar19) = 0;
    *(undefined8 *)((long)&local_200 + lVar19) = 0x7ff0000000000000;
    *(undefined8 *)(&local_1f8.m_data[0].m_hasNaN + lVar19) = 0xfff0000000000000;
    lVar19 = lVar19 + 0x18;
  } while (lVar19 != 0x70);
  lVar19 = 0x10;
  do {
    *(undefined1 *)((long)&local_208 + lVar19) = 0;
    *(undefined8 *)((long)&local_200 + lVar19) = 0x7ff0000000000000;
    *(undefined8 *)(&local_1f8.m_data[0].m_hasNaN + lVar19) = 0xfff0000000000000;
    lVar19 = lVar19 + 0x18;
  } while (lVar19 != 0x70);
  lVar19 = 0x10;
  do {
    *(undefined1 *)((long)&local_550 + lVar19) = 0;
    *(undefined8 *)((long)&local_548 + lVar19) = 0x7ff0000000000000;
    *(undefined8 *)(local_540 + lVar19) = 0xfff0000000000000;
    lVar19 = lVar19 + 0x18;
  } while (lVar19 != 0x70);
  lVar19 = 0x10;
  do {
    *(undefined1 *)((long)&local_550 + lVar19) = 0;
    *(undefined8 *)((long)&local_548 + lVar19) = 0x7ff0000000000000;
    *(undefined8 *)(local_540 + lVar19) = 0xfff0000000000000;
    lVar19 = lVar19 + 0x18;
  } while (lVar19 != 0x70);
  Environment::bind<tcu::Vector<float,4>>
            ((Environment *)&local_2a8,
             (this->m_variables).in0.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_4>_>_>.m_ptr,
             (IVal *)local_498);
  Environment::bind<tcu::Vector<int,4>>
            ((Environment *)&local_2a8,
             (this->m_variables).in1.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<int,_4>_>_>.m_ptr,
             &local_1f8);
  Environment::bind<vkt::shaderexecutor::Void>
            ((Environment *)&local_2a8,
             (this->m_variables).in2.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr,
             (IVal *)&local_578);
  Environment::bind<vkt::shaderexecutor::Void>
            ((Environment *)&local_2a8,
             (this->m_variables).in3.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr,
             (IVal *)&local_4d0);
  Environment::bind<tcu::Vector<float,4>>
            ((Environment *)&local_2a8,
             (this->m_variables).out0.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_4>_>_>.m_ptr,
             (IVal *)local_540);
  Environment::bind<vkt::shaderexecutor::Void>
            ((Environment *)&local_2a8,
             (this->m_variables).out1.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr,
             &local_551);
  if (local_278.in0.
      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
      super__Vector_impl_data._M_finish == local_550) {
    local_550 = (pointer)0x0;
  }
  else {
    local_4a8 = local_4e0 + (local_4e0 == 0);
    lVar19 = 0;
    local_550 = (pointer)0x0;
    do {
      lVar20 = 0x10;
      do {
        *(undefined1 *)((long)&local_208 + lVar20) = 0;
        *(undefined8 *)((long)&local_200 + lVar20) = 0x7ff0000000000000;
        *(undefined8 *)(&local_1f8.m_data[0].m_hasNaN + lVar20) = 0xfff0000000000000;
        lVar20 = lVar20 + 0x18;
      } while (lVar20 != 0x70);
      lVar20 = 0x10;
      do {
        *(undefined1 *)((long)&local_208 + lVar20) = 0;
        *(undefined8 *)((long)&local_200 + lVar20) = 0x7ff0000000000000;
        *(undefined8 *)(&local_1f8.m_data[0].m_hasNaN + lVar20) = 0xfff0000000000000;
        lVar20 = lVar20 + 0x18;
      } while (lVar20 != 0x70);
      local_578._M_dataplus._M_p =
           *(pointer *)
            local_278.in0.
            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
            _M_impl.super__Vector_impl_data._M_start[lVar19].m_data;
      local_578._M_string_length =
           *(size_type *)
            (local_278.in0.
             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
             _M_impl.super__Vector_impl_data._M_start[lVar19].m_data + 2);
      local_4a0 = lVar19;
      ContainerTraits<tcu::Vector<float,_4>,_tcu::Vector<tcu::Interval,_4>_>::doRound
                ((IVal *)local_540,pFVar27,(Vector<float,_4> *)&local_578);
      ContainerTraits<tcu::Vector<float,_4>,_tcu::Vector<tcu::Interval,_4>_>::doConvert
                ((IVal *)local_498,pFVar27,(IVal *)local_540);
      pIVar21 = Environment::lookup<tcu::Vector<float,4>>
                          ((Environment *)&local_2a8,
                           (this->m_variables).in0.
                           super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_4>_>_>
                           .m_ptr);
      pIVar23 = (IVal *)local_498;
      for (lVar20 = 0xc; lVar20 != 0; lVar20 = lVar20 + -1) {
        uVar13 = *(undefined7 *)&pIVar23->m_data[0].field_0x1;
        pIVar21->m_data[0].m_hasNaN = pIVar23->m_data[0].m_hasNaN;
        *(undefined7 *)&pIVar21->m_data[0].field_0x1 = uVar13;
        pIVar23 = (IVal *)((long)pIVar23 + ((ulong)bVar31 * -2 + 1) * 8);
        pIVar21 = (IVal *)((long)pIVar21 + ((ulong)bVar31 * -2 + 1) * 8);
      }
      local_578._M_dataplus._M_p =
           *(pointer *)
            local_278.in1.
            super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>._M_impl.
            super__Vector_impl_data._M_start[lVar19].m_data;
      local_578._M_string_length =
           *(size_type *)
            (local_278.in1.
             super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>._M_impl.
             super__Vector_impl_data._M_start[lVar19].m_data + 2);
      ContainerTraits<tcu::Vector<int,_4>,_tcu::Vector<tcu::Interval,_4>_>::doRound
                ((IVal *)local_540,pFVar27,(Vector<int,_4> *)&local_578);
      ContainerTraits<tcu::Vector<int,_4>,_tcu::Vector<tcu::Interval,_4>_>::doConvert
                ((IVal *)local_498,pFVar27,(IVal *)local_540);
      pIVar22 = Environment::lookup<tcu::Vector<int,4>>
                          ((Environment *)&local_2a8,
                           (this->m_variables).in1.
                           super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<int,_4>_>_>
                           .m_ptr);
      pIVar23 = (IVal *)local_498;
      for (lVar20 = 0xc; lVar20 != 0; lVar20 = lVar20 + -1) {
        uVar13 = *(undefined7 *)&pIVar23->m_data[0].field_0x1;
        pIVar22->m_data[0].m_hasNaN = pIVar23->m_data[0].m_hasNaN;
        *(undefined7 *)&pIVar22->m_data[0].field_0x1 = uVar13;
        pIVar23 = (IVal *)((long)pIVar23 + ((ulong)bVar31 * -2 + 1) * 8);
        pIVar22 = (IVal *)((long)pIVar22 + ((ulong)bVar31 * -2 + 1) * 8);
      }
      Environment::lookup<vkt::shaderexecutor::Void>
                ((Environment *)&local_2a8,
                 (this->m_variables).in2.
                 super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.
                 m_ptr);
      Environment::lookup<vkt::shaderexecutor::Void>
                ((Environment *)&local_2a8,
                 (this->m_variables).in3.
                 super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.
                 m_ptr);
      local_470 = (this->m_caseCtx).precision;
      local_478 = pFVar27->m_maxValue;
      local_498._0_8_ = *(undefined8 *)pFVar27;
      local_498._8_4_ = pFVar27->m_fractionBits;
      local_498._12_4_ = pFVar27->m_hasSubnormal;
      local_498._16_4_ = pFVar27->m_hasInf;
      local_498._20_4_ = pFVar27->m_hasNaN;
      local_498[0x18] = pFVar27->m_exactPrecision;
      local_498._25_3_ = *(undefined3 *)&pFVar27->field_0x19;
      local_498._28_4_ = *(undefined4 *)&pFVar27->field_0x1c;
      local_460 = 0;
      pSVar8 = (this->m_stmt).super_SharedPtr<const_vkt::shaderexecutor::Statement>.m_ptr;
      local_468 = &local_2a8;
      (*pSVar8->_vptr_Statement[3])(pSVar8,local_498);
      pIVar23 = Environment::lookup<tcu::Vector<float,4>>
                          ((Environment *)&local_2a8,
                           (this->m_variables).out0.
                           super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_4>_>_>
                           .m_ptr);
      ContainerTraits<tcu::Vector<float,_4>,_tcu::Vector<tcu::Interval,_4>_>::doConvert
                ((IVal *)local_498,&local_2e8,pIVar23);
      psVar28 = (string *)local_498;
      pIVar23 = &local_1f8;
      for (lVar20 = 0xc; lVar20 != 0; lVar20 = lVar20 + -1) {
        *(pointer *)pIVar23->m_data = (psVar28->_M_dataplus)._M_p;
        psVar28 = (string *)((long)psVar28 + (ulong)bVar31 * -0x10 + 8);
        pIVar23 = (IVal *)((long)pIVar23 + ((ulong)bVar31 * -2 + 1) * 8);
      }
      bVar16 = ContainerTraits<tcu::Vector<float,_4>,_tcu::Vector<tcu::Interval,_4>_>::doContains
                         (&local_1f8,
                          local_318.out0.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + lVar19);
      local_498._0_8_ = local_498 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_498,"Shader output 0 is outside acceptable range","");
      bVar16 = tcu::ResultCollector::check(&local_80,bVar16,(string *)local_498);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_498._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(local_498 + 0x10)) {
        operator_delete((void *)local_498._0_8_,CONCAT44(local_498._20_4_,local_498._16_4_) + 1);
      }
      uVar25 = (int)local_550 + ((byte)~bVar16 & 1);
      local_550 = (pointer)(ulong)uVar25;
      if ((int)uVar25 < 0x65 && !bVar16) {
        local_498._0_8_ = local_548;
        poVar4 = (ostringstream *)(local_498 + 8);
        std::__cxx11::ostringstream::ostringstream(poVar4);
        pcVar29 = "Failed";
        if (bVar16) {
          pcVar29 = "Passed";
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4,pcVar29,6);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4," sample:\n",9);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4,"\t",1);
        pVVar10 = (this->m_variables).in0.
                  super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_4>_>_>.
                  m_ptr;
        paVar26 = &local_530;
        pcVar11 = (pVVar10->m_name)._M_dataplus._M_p;
        local_540._0_8_ = paVar26;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_540,pcVar11,pcVar11 + (pVVar10->m_name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_498 + 8),(char *)local_540._0_8_,
                   CONCAT44(local_540._12_4_,local_540._8_4_));
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_498 + 8)," = ",3);
        valueToString<tcu::Vector<float,4>>
                  (&local_578,(shaderexecutor *)&local_2e8,
                   (FloatFormat *)
                   (local_278.in0.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + lVar19),(Vector<float,_4> *)paVar26)
        ;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_498 + 8),local_578._M_dataplus._M_p,local_578._M_string_length)
        ;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_498 + 8),"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_578._M_dataplus._M_p != &local_578.field_2) {
          operator_delete(local_578._M_dataplus._M_p,local_578.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_540._0_8_ != &local_530) {
          operator_delete((void *)local_540._0_8_,(ulong)(local_530._M_allocated_capacity + 1));
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_498 + 8),"\t",1);
        pVVar12 = (this->m_variables).in1.
                  super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<int,_4>_>_>.m_ptr;
        paVar26 = &local_530;
        pcVar11 = (pVVar12->m_name)._M_dataplus._M_p;
        local_540._0_8_ = paVar26;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_540,pcVar11,pcVar11 + (pVVar12->m_name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_498 + 8),(char *)local_540._0_8_,
                   CONCAT44(local_540._12_4_,local_540._8_4_));
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_498 + 8)," = ",3);
        valueToString<tcu::Vector<int,4>>
                  (&local_578,(shaderexecutor *)&local_2e8,
                   (FloatFormat *)
                   (local_278.in1.
                    super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
                    _M_impl.super__Vector_impl_data._M_start + lVar19),(Vector<int,_4> *)paVar26);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_498 + 8),local_578._M_dataplus._M_p,local_578._M_string_length)
        ;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_498 + 8),"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_578._M_dataplus._M_p != &local_578.field_2) {
          operator_delete(local_578._M_dataplus._M_p,local_578.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_540._0_8_ != &local_530) {
          operator_delete((void *)local_540._0_8_,(ulong)(local_530._M_allocated_capacity + 1));
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_498 + 8),"\t",1);
        pVVar10 = (this->m_variables).out0.
                  super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_4>_>_>.
                  m_ptr;
        paVar26 = &local_530;
        pcVar11 = (pVVar10->m_name)._M_dataplus._M_p;
        local_540._0_8_ = paVar26;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_540,pcVar11,pcVar11 + (pVVar10->m_name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_498 + 8),(char *)local_540._0_8_,
                   CONCAT44(local_540._12_4_,local_540._8_4_));
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_498 + 8)," = ",3);
        valueToString<tcu::Vector<float,4>>
                  (&local_578,(shaderexecutor *)&local_2e8,
                   (FloatFormat *)
                   (local_318.out0.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + lVar19),(Vector<float,_4> *)paVar26)
        ;
        poVar5 = (ostream *)(local_498 + 8);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar5,local_578._M_dataplus._M_p,local_578._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\tExpected range: ",0x11);
        intervalToString<tcu::Vector<float,4>>
                  (&local_4d0,(shaderexecutor *)&local_2e8,(FloatFormat *)&local_1f8,(IVal *)paVar26
                  );
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar5,local_4d0._M_dataplus._M_p,local_4d0._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4d0._M_dataplus._M_p != &local_4d0.field_2) {
          operator_delete(local_4d0._M_dataplus._M_p,local_4d0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_578._M_dataplus._M_p != &local_578.field_2) {
          operator_delete(local_578._M_dataplus._M_p,local_578.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_540._0_8_ != &local_530) {
          operator_delete((void *)local_540._0_8_,(ulong)(local_530._M_allocated_capacity + 1));
        }
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_498,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_498 + 8));
        std::ios_base::~ios_base(local_420);
      }
      lVar19 = local_4a0 + 1;
      pFVar27 = local_4d8;
    } while (lVar19 != local_4a8);
  }
  pTVar14 = local_4b0;
  iVar17 = (int)local_550;
  if (100 < iVar17) {
    poVar4 = (ostringstream *)(local_498 + 8);
    local_498._0_8_ = local_548;
    std::__cxx11::ostringstream::ostringstream(poVar4);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4,"(Skipped ",9);
    std::ostream::operator<<(poVar4,iVar17 + -100);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4," messages.)",0xb);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_498,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar4);
    std::ios_base::~ios_base(local_420);
  }
  poVar4 = (ostringstream *)(local_498 + 8);
  if (iVar17 == 0) {
    local_498._0_8_ = local_548;
    std::__cxx11::ostringstream::ostringstream(poVar4);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4,"All ",4);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4," inputs passed.",0xf);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_498,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  else {
    local_498._0_8_ = local_548;
    std::__cxx11::ostringstream::ostringstream(poVar4);
    std::ostream::operator<<(poVar4,iVar17);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4,"/",1);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4," inputs failed.",0xf);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_498,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  std::__cxx11::ostringstream::~ostringstream(poVar4);
  std::ios_base::~ios_base(local_420);
  if (iVar17 == 0) {
    local_498._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)(local_498 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_498,"Pass","");
    pTVar14->m_code = QP_TEST_RESULT_PASS;
    (pTVar14->m_description)._M_dataplus._M_p = (pointer)&(pTVar14->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&pTVar14->m_description,local_498._0_8_,
               (char *)(local_498._0_8_ + CONCAT44(local_498._12_4_,local_498._8_4_)));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_498._0_8_ ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(local_498 + 0x10)) goto LAB_009c817c;
    uVar18 = (_Base_ptr)CONCAT44(local_498._20_4_,local_498._16_4_);
    paVar26 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_498._0_8_;
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_498);
    std::ostream::operator<<(local_498,iVar17);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_498);
    std::ios_base::~ios_base(local_428);
    paVar26 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_498 + 0x10);
    local_498._0_8_ = paVar26;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_498," test failed. Check log for the details","");
    p_Var2 = (_Base_ptr)
             (CONCAT44(local_498._12_4_,local_498._8_4_) +
             CONCAT44(local_540._12_4_,local_540._8_4_));
    uVar18 = (_Base_ptr)0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_540._0_8_ != &local_530) {
      uVar18 = local_530._M_allocated_capacity;
    }
    if ((ulong)uVar18 < p_Var2) {
      p_Var30 = (_Base_ptr)0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_498._0_8_ != paVar26) {
        p_Var30 = (_Base_ptr)CONCAT44(local_498._20_4_,local_498._16_4_);
      }
      if (p_Var30 < p_Var2) goto LAB_009c8011;
      puVar24 = (undefined8 *)
                std::__cxx11::string::replace((ulong)local_498,0,(char *)0x0,local_540._0_8_);
    }
    else {
LAB_009c8011:
      puVar24 = (undefined8 *)std::__cxx11::string::_M_append(local_540,local_498._0_8_);
    }
    local_1f8.m_data[0]._0_8_ = &local_1f8.m_data[0].m_hi;
    pdVar1 = (double *)(puVar24 + 2);
    if ((double *)*puVar24 == pdVar1) {
      local_1f8.m_data[0].m_hi = *pdVar1;
      local_1f8.m_data[1]._0_4_ = *(undefined4 *)(puVar24 + 3);
      local_1f8.m_data[1]._4_4_ = *(undefined4 *)((long)puVar24 + 0x1c);
    }
    else {
      local_1f8.m_data[0].m_hi = *pdVar1;
      local_1f8.m_data[0]._0_8_ = (double *)*puVar24;
    }
    local_1f8.m_data[0].m_lo = (double)puVar24[1];
    *puVar24 = pdVar1;
    puVar24[1] = 0;
    *(undefined1 *)pdVar1 = 0;
    pTVar14->m_code = QP_TEST_RESULT_FAIL;
    (pTVar14->m_description)._M_dataplus._M_p = (pointer)&(pTVar14->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&pTVar14->m_description,local_1f8.m_data[0]._0_8_,
               (undefined1 *)((long)local_1f8.m_data[0].m_lo + local_1f8.m_data[0]._0_8_));
    if ((double *)local_1f8.m_data[0]._0_8_ != &local_1f8.m_data[0].m_hi) {
      operator_delete((void *)local_1f8.m_data[0]._0_8_,(long)local_1f8.m_data[0].m_hi + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_498._0_8_ != paVar26) {
      operator_delete((void *)local_498._0_8_,CONCAT44(local_498._20_4_,local_498._16_4_) + 1);
    }
    uVar18 = local_530._M_allocated_capacity;
    paVar26 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_540._0_8_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_540._0_8_ == &local_530) goto LAB_009c817c;
  }
  operator_delete(paVar26,(ulong)((long)&((_Base_ptr)uVar18)->_M_color + 1));
LAB_009c817c:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.m_message._M_dataplus._M_p != &local_80.m_message.field_2) {
    operator_delete(local_80.m_message._M_dataplus._M_p,
                    local_80.m_message.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.m_prefix._M_dataplus._M_p != &local_80.m_prefix.field_2) {
    operator_delete(local_80.m_prefix._M_dataplus._M_p,
                    local_80.m_prefix.field_2._M_allocated_capacity + 1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  ::~_Rb_tree(&local_2a8);
  if (local_318.out1.
      super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_318.out1.
                    super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_318.out1.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_318.out1.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_318.out0.
      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_318.out0.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_318.out0.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_318.out0.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_278.in3.
      super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_278.in3.
                    super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_278.in3.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_278.in3.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_278.in2.
      super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_278.in2.
                    super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_278.in2.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_278.in2.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_278.in1.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_278.in1.
                    super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_278.in1.
                          super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_278.in1.
                          super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_278.in0.
      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_278.in0.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_278.in0.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_278.in0.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return pTVar14;
}

Assistant:

tcu::TestStatus BuiltinPrecisionCaseTestInstance<In, Out>::iterate (void)
{
	typedef typename	In::In0		In0;
	typedef typename	In::In1		In1;
	typedef typename	In::In2		In2;
	typedef typename	In::In3		In3;
	typedef typename	Out::Out0	Out0;
	typedef typename	Out::Out1	Out1;

	Inputs<In>			inputs		= generateInputs(m_samplings, m_caseCtx.floatFormat, m_caseCtx.precision, m_caseCtx.numRandoms, 0xdeadbeefu + m_caseCtx.testContext.getCommandLine().getBaseSeed());
	const FloatFormat&	fmt			= m_caseCtx.floatFormat;
	const int			inCount		= numInputs<In>();
	const int			outCount	= numOutputs<Out>();
	const size_t		numValues	= (inCount > 0) ? inputs.in0.size() : 1;
	Outputs<Out>		outputs		(numValues);
	const FloatFormat	highpFmt	= m_caseCtx.highpFormat;
	const int			maxMsgs		= 100;
	int					numErrors	= 0;
	Environment			env;		// Hoisted out of the inner loop for optimization.
	ResultCollector		status;
	TestLog&			testLog		= m_context.getTestContext().getLog();

	const void*			inputArr[]	=
	{
		&inputs.in0.front(), &inputs.in1.front(), &inputs.in2.front(), &inputs.in3.front(),
	};
	void*				outputArr[]	=
	{
		&outputs.out0.front(), &outputs.out1.front(),
	};

	// Print out the statement and its definitions
	testLog << TestLog::Message << "Statement: " << m_stmt << TestLog::EndMessage;
	{
		ostringstream	oss;
		FuncSet			funcs;

		m_stmt->getUsedFuncs(funcs);
		for (FuncSet::const_iterator it = funcs.begin(); it != funcs.end(); ++it)
		{
			(*it)->printDefinition(oss);
		}
		if (!funcs.empty())
			testLog << TestLog::Message << "Reference definitions:\n" << oss.str()
				  << TestLog::EndMessage;
	}

	switch (inCount)
	{
		case 4: DE_ASSERT(inputs.in3.size() == numValues);
		case 3: DE_ASSERT(inputs.in2.size() == numValues);
		case 2: DE_ASSERT(inputs.in1.size() == numValues);
		case 1: DE_ASSERT(inputs.in0.size() == numValues);
		default: break;
	}

	m_executor->execute(int(numValues), inputArr, outputArr);

	// Initialize environment with dummy values so we don't need to bind in inner loop.
	{
		const typename Traits<In0>::IVal		in0;
		const typename Traits<In1>::IVal		in1;
		const typename Traits<In2>::IVal		in2;
		const typename Traits<In3>::IVal		in3;
		const typename Traits<Out0>::IVal		reference0;
		const typename Traits<Out1>::IVal		reference1;

		env.bind(*m_variables.in0, in0);
		env.bind(*m_variables.in1, in1);
		env.bind(*m_variables.in2, in2);
		env.bind(*m_variables.in3, in3);
		env.bind(*m_variables.out0, reference0);
		env.bind(*m_variables.out1, reference1);
	}

	// For each input tuple, compute output reference interval and compare
	// shader output to the reference.
	for (size_t valueNdx = 0; valueNdx < numValues; valueNdx++)
	{
		bool						result		= true;
		typename Traits<Out0>::IVal	reference0;
		typename Traits<Out1>::IVal	reference1;

		env.lookup(*m_variables.in0) = convert<In0>(fmt, round(fmt, inputs.in0[valueNdx]));
		env.lookup(*m_variables.in1) = convert<In1>(fmt, round(fmt, inputs.in1[valueNdx]));
		env.lookup(*m_variables.in2) = convert<In2>(fmt, round(fmt, inputs.in2[valueNdx]));
		env.lookup(*m_variables.in3) = convert<In3>(fmt, round(fmt, inputs.in3[valueNdx]));

		{
			EvalContext	ctx (fmt, m_caseCtx.precision, env);
			m_stmt->execute(ctx);
		}

		switch (outCount)
		{
			case 2:
				reference1 = convert<Out1>(highpFmt, env.lookup(*m_variables.out1));
				if (!status.check(contains(reference1, outputs.out1[valueNdx]),
									"Shader output 1 is outside acceptable range"))
					result = false;
			case 1:
				reference0 = convert<Out0>(highpFmt, env.lookup(*m_variables.out0));
				if (!status.check(contains(reference0, outputs.out0[valueNdx]),
									"Shader output 0 is outside acceptable range"))
					result = false;
			default: break;
		}

		if (!result)
			++numErrors;

		if ((!result && numErrors <= maxMsgs) || GLS_LOG_ALL_RESULTS)
		{
			MessageBuilder	builder	= testLog.message();

			builder << (result ? "Passed" : "Failed") << " sample:\n";

			if (inCount > 0)
			{
				builder << "\t" << m_variables.in0->getName() << " = "
						<< valueToString(highpFmt, inputs.in0[valueNdx]) << "\n";
			}

			if (inCount > 1)
			{
				builder << "\t" << m_variables.in1->getName() << " = "
						<< valueToString(highpFmt, inputs.in1[valueNdx]) << "\n";
			}

			if (inCount > 2)
			{
				builder << "\t" << m_variables.in2->getName() << " = "
						<< valueToString(highpFmt, inputs.in2[valueNdx]) << "\n";
			}

			if (inCount > 3)
			{
				builder << "\t" << m_variables.in3->getName() << " = "
						<< valueToString(highpFmt, inputs.in3[valueNdx]) << "\n";
			}

			if (outCount > 0)
			{
				builder << "\t" << m_variables.out0->getName() << " = "
						<< valueToString(highpFmt, outputs.out0[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out0>(highpFmt, reference0) << "\n";
			}

			if (outCount > 1)
			{
				builder << "\t" << m_variables.out1->getName() << " = "
						<< valueToString(highpFmt, outputs.out1[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out1>(highpFmt, reference1) << "\n";
			}

			builder << TestLog::EndMessage;
		}
	}

	if (numErrors > maxMsgs)
	{
		testLog << TestLog::Message << "(Skipped " << (numErrors - maxMsgs) << " messages.)"
			  << TestLog::EndMessage;
	}

	if (numErrors == 0)
	{
		testLog << TestLog::Message << "All " << numValues << " inputs passed."
			  << TestLog::EndMessage;
	}
	else
	{
		testLog << TestLog::Message << numErrors << "/" << numValues << " inputs failed."
			  << TestLog::EndMessage;
	}

	if (numErrors)
		return tcu::TestStatus::fail(de::toString(numErrors) + string(" test failed. Check log for the details"));
	else
		return tcu::TestStatus::pass("Pass");

}